

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

char * nng_strerror(nng_err num)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  char *__format;
  char *pcVar4;
  bool bVar5;
  
  uVar2 = (ulong)num;
  if (num == NNG_OK) {
    pcVar4 = "Hunky dory";
    bVar5 = false;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x200) goto LAB_0010da47;
      lVar1 = lVar3 + 0x10;
    } while (*(nng_err *)((long)&nni_errors[1].code + lVar3) != num);
    pcVar4 = *(char **)((long)&nni_errors[1].msg + lVar3);
    bVar5 = pcVar4 == (char *)0x0;
  }
  if (bVar5) {
LAB_0010da47:
    if ((num >> 0x1c & 1) != 0) {
      pcVar4 = nni_plat_strerror(num & ~NNG_ESYSERR);
      return pcVar4;
    }
    if ((num >> 0x1d & 1) == 0) {
      pcVar4 = nng_strerror::unknownerrbuf;
      __format = "Unknown error #%d";
    }
    else {
      uVar2 = (ulong)(num & ~(NNG_ETRANERR|NNG_ESYSERR));
      pcVar4 = nng_strerror::tranerrbuf;
      __format = "Transport error #%d";
    }
    snprintf(pcVar4,0x20,__format,uVar2);
  }
  return pcVar4;
}

Assistant:

const char *
nng_strerror(nng_err num)
{
	static char unknownerrbuf[32];
	for (int i = 0; nni_errors[i].msg != NULL; i++) {
		if (nni_errors[i].code == num) {
			return (nni_errors[i].msg);
		}
	}

	if (num & NNG_ESYSERR) {
		return (nni_plat_strerror(num & ~NNG_ESYSERR));
	}

	if (num & NNG_ETRANERR) {
		static char tranerrbuf[32];
		(void) snprintf(tranerrbuf, sizeof(tranerrbuf),
		    "Transport error #%d", num & ~NNG_ETRANERR);
		return (tranerrbuf);
	}

	(void) snprintf(
	    unknownerrbuf, sizeof(unknownerrbuf), "Unknown error #%d", num);
	return (unknownerrbuf);
}